

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

BOOL StartOrganya(char *path_wave)

{
  BOOL BVar1;
  char *path_wave_local;
  
  if (audio_backend_initialised) {
    BVar1 = InitWaveData100(path_wave);
    if (BVar1) {
      OrgData::InitOrgData(&org_data);
      path_wave_local._7_1_ = true;
    }
    else {
      path_wave_local._7_1_ = false;
    }
  }
  else {
    path_wave_local._7_1_ = false;
  }
  return path_wave_local._7_1_;
}

Assistant:

BOOL StartOrganya(const char *path_wave)
{
	if (!audio_backend_initialised)
		return FALSE;

	if (!InitWaveData100(path_wave))
		return FALSE;

	org_data.InitOrgData();

	return TRUE;
}